

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_ussub8_arm(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  undefined1 uVar3;
  int iVar4;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    iVar4 = (uint)*(byte *)((long)a + uVar2) - (uint)*(byte *)((long)b + uVar2);
    uVar3 = (undefined1)iVar4;
    if (iVar4 < 1) {
      uVar3 = 0;
    }
    *(undefined1 *)((long)d + uVar2) = uVar3;
    uVar2 = uVar2 + 1;
  } while (uVar1 + 8 != uVar2);
  if (uVar1 < (desc >> 2 & 0xf8)) {
    helper_gvec_ussub8_arm_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_ussub8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        int r = *(uint8_t *)((char *)a + i) - *(uint8_t *)((char *)b + i);
        if (r < 0) {
            r = 0;
        }
        *(uint8_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}